

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

CURLcode Curl_conn_recv(Curl_easy *data,int sockindex,char *buf,size_t blen,ssize_t *n)

{
  ssize_t local_48;
  ssize_t nread;
  ssize_t *psStack_30;
  CURLcode result;
  ssize_t *n_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *pCStack_10;
  int sockindex_local;
  Curl_easy *data_local;
  
  nread._4_4_ = CURLE_OK;
  psStack_30 = n;
  n_local = (ssize_t *)blen;
  blen_local = (size_t)buf;
  buf_local._4_4_ = sockindex;
  pCStack_10 = data;
  local_48 = (*data->conn->recv[sockindex])(data,sockindex,buf,blen,(CURLcode *)((long)&nread + 4));
  if (local_48 < 0) {
    local_48 = 0;
  }
  *psStack_30 = local_48;
  return nread._4_4_;
}

Assistant:

CURLcode Curl_conn_recv(struct Curl_easy *data, int sockindex,
                        char *buf, size_t blen, ssize_t *n)
{
  CURLcode result = CURLE_OK;
  ssize_t nread;

  DEBUGASSERT(data->conn);
  nread = data->conn->recv[sockindex](data, sockindex, buf, blen, &result);
  DEBUGASSERT(nread >= 0 || result);
  DEBUGASSERT(nread < 0 || !result);
  *n = (nread >= 0) ? (size_t)nread : 0;
  return result;
}